

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture_extraction.hpp
# Opt level: O1

Image4u * eos::render::extract_texture
                    (Image4u *__return_storage_ptr__,Mesh *mesh,Matrix4f *view_model_matrix,
                    Matrix4f *projection_matrix,ProjectionType projection_type,Image4u *image,
                    int texturemap_resolution)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this;
  int iVar1;
  pointer paVar2;
  pointer pMVar3;
  pointer paVar4;
  pointer paVar5;
  pointer pMVar6;
  pointer __dest;
  Image4u *pIVar7;
  pointer paVar8;
  vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *pvVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  Matrix<float,_3,_1,_0,_3,_1> *vtx;
  pointer pMVar14;
  long lVar15;
  size_t __n;
  float fVar16;
  float fVar17;
  float fVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  anon_class_16_2_aecbacc2 __f;
  vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
  wnd_coords;
  vector<bool,_std::allocator<bool>_> per_vertex_visibility;
  Vertex<double> pa;
  Vector4f clip_coords;
  Texture image_to_extract_from_as_tex;
  Rasterizer<eos::render::ExtractionFragmentShader> extraction_rasterizer;
  Vertex<double> pc;
  void *local_238;
  iterator iStack_230;
  Matrix<float,_4,_1,_0,_4,_1> *local_228;
  vector<bool,_std::allocator<bool>_> local_218;
  Image4u *local_1f0;
  vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *local_1e8;
  vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *local_1e0;
  Vertex<double> local_1d8;
  undefined1 local_188 [8];
  undefined8 uStack_180;
  double local_178;
  double local_170;
  double local_148;
  double local_140;
  optional<eos::render::Texture> local_130;
  Texture local_108;
  Rasterizer<eos::render::ExtractionFragmentShader> local_e8;
  Vertex<double> local_88;
  
  if ((((long)(mesh->vertices).
              super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(mesh->vertices).
              super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
              ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555 -
       ((long)(mesh->texcoords).
              super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(mesh->texcoords).
              super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
              ._M_impl.super__Vector_impl_data._M_start >> 3) != 0) &&
     ((mesh->tti).super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      (mesh->tti).super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>.
      _M_impl.super__Vector_impl_data._M_finish)) {
    __assert_fail("mesh.vertices.size() == mesh.texcoords.size() || !mesh.tti.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/include/eos/render/texture_extraction.hpp"
                  ,0x4d,
                  "eos::core::Image4u eos::render::extract_texture(const core::Mesh &, Eigen::Matrix4f, Eigen::Matrix4f, ProjectionType, const eos::core::Image4u &, int)"
                 );
  }
  paVar8 = (mesh->tti).
           super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  paVar2 = (mesh->tti).
           super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((paVar8 != paVar2) &&
     ((long)paVar2 - (long)paVar8 !=
      (long)(mesh->tvi).
            super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>._M_impl
            .super__Vector_impl_data._M_finish -
      (long)(mesh->tvi).
            super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>._M_impl
            .super__Vector_impl_data._M_start)) {
    __assert_fail("mesh.tti.empty() || mesh.tti.size() == mesh.tvi.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/include/eos/render/texture_extraction.hpp"
                  ,0x4f,
                  "eos::core::Image4u eos::render::extract_texture(const core::Mesh &, Eigen::Matrix4f, Eigen::Matrix4f, ProjectionType, const eos::core::Image4u &, int)"
                 );
  }
  local_e8.enable_depth_test = true;
  local_e8.perspective_correct_barycentric_weights = true;
  local_e8.enable_far_clipping = true;
  local_e8.viewport_width = texturemap_resolution;
  local_e8.viewport_height = texturemap_resolution;
  local_e8.colorbuffer.height_ = 0;
  local_e8.colorbuffer.width_ = 0;
  local_e8.colorbuffer.row_stride = 0;
  local_e8.depthbuffer.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.depthbuffer.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8.depthbuffer.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e8.colorbuffer.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.colorbuffer.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8.colorbuffer.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e8.depthbuffer.height_ = 0;
  local_e8.depthbuffer.width_ = 0;
  local_e8.depthbuffer.row_stride = 0;
  Rasterizer<eos::render::ExtractionFragmentShader>::clear_buffers(&local_e8);
  create_mipmapped_texture(&local_108,image,1);
  local_e8.enable_depth_test = false;
  local_e8.perspective_correct_barycentric_weights = false;
  local_1d8.position.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
  array[0] = 0.0;
  local_1d8.position.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
  array[1] = 0.0;
  local_1d8.position.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
  array[2] = 0.0;
  __f.modelview = view_model_matrix;
  __f.viewspace_vertices =
       (vector<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
        *)&local_1d8;
  std::
  for_each<__gnu_cxx::__normal_iterator<Eigen::Matrix<float,3,1,0,3,1>const*,std::vector<Eigen::Matrix<float,3,1,0,3,1>,std::allocator<Eigen::Matrix<float,3,1,0,3,1>>>>,eos::render::compute_per_vertex_self_occlusion(std::vector<Eigen::Matrix<float,3,1,0,3,1>,std::allocator<Eigen::Matrix<float,3,1,0,3,1>>>const&,std::vector<std::array<int,3ul>,std::allocator<std::array<int,3ul>>>const&,Eigen::Matrix<float,4,4,0,4,4>const&,eos::render::detail::RayDirection)::_lambda(auto:1_const&)_1_>
            ((mesh->vertices).
             super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (mesh->vertices).
             super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_finish,__f);
  local_1e0 = &mesh->tvi;
  compute_per_vertex_self_occlusion
            (&local_218,
             (vector<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
              *)&local_1d8,local_1e0,(uint)(projection_type != Orthographic));
  local_1f0 = __return_storage_ptr__;
  if ((Matrix4f *)
      local_1d8.position.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[0] != (Matrix4f *)0x0) {
    operator_delete((void *)local_1d8.position.
                            super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                            m_data.array[0],
                    (long)local_1d8.position.
                          super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                          m_data.array[2] -
                    (long)local_1d8.position.
                          super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                          m_data.array[0]);
  }
  local_238 = (void *)0x0;
  iStack_230._M_current = (Matrix<float,_4,_1,_0,_4,_1> *)0x0;
  local_228 = (Matrix<float,_4,_1,_0,_4,_1> *)0x0;
  pMVar14 = (mesh->vertices).
            super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pMVar3 = (mesh->vertices).
           super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pMVar14 != pMVar3) {
    do {
      local_1d8.position.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[0] = (double)projection_matrix;
      local_1d8.position.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[1] = (double)view_model_matrix;
      local_1d8.position.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[2] = (double)pMVar14;
      Eigen::internal::
      homogeneous_left_product_impl<Eigen::Homogeneous<Eigen::Matrix<float,3,1,0,3,1>,0>,Eigen::Product<Eigen::Matrix<float,4,4,0,4,4>,Eigen::Matrix<float,4,4,0,4,4>,0>>
      ::evalTo<Eigen::Matrix<float,4,1,0,4,1>>
                ((homogeneous_left_product_impl<Eigen::Homogeneous<Eigen::Matrix<float,3,1,0,3,1>,0>,Eigen::Product<Eigen::Matrix<float,4,4,0,4,4>,Eigen::Matrix<float,4,4,0,4,4>,0>>
                  *)&local_1d8,(Matrix<float,_4,_1,_0,_4,_1> *)local_188);
      auVar19._4_4_ = uStack_180._4_4_;
      auVar19._0_4_ = uStack_180._4_4_;
      auVar19._8_4_ = uStack_180._4_4_;
      auVar19._12_4_ = uStack_180._4_4_;
      auVar19 = divps((undefined1  [16])_local_188,auVar19);
      auVar20._0_12_ = auVar19._0_12_;
      auVar20._12_4_ = 1.0 / uStack_180._4_4_;
      local_188._0_4_ = auVar19._0_4_;
      local_188._4_4_ = auVar19._4_4_;
      uStack_180 = auVar20._8_8_;
      local_188._4_4_ =
           (float)image->height_ - (float)image->height_ * 0.5 * ((float)local_188._4_4_ + 1.0);
      local_188._0_4_ = (float)image->width_ * 0.5 * ((float)local_188._0_4_ + 1.0);
      if (iStack_230._M_current == local_228) {
        std::vector<Eigen::Matrix<float,4,1,0,4,1>,std::allocator<Eigen::Matrix<float,4,1,0,4,1>>>::
        _M_realloc_insert<Eigen::Matrix<float,4,1,0,4,1>const&>
                  ((vector<Eigen::Matrix<float,4,1,0,4,1>,std::allocator<Eigen::Matrix<float,4,1,0,4,1>>>
                    *)&local_238,iStack_230,(Matrix<float,_4,_1,_0,_4,_1> *)local_188);
      }
      else {
        *(undefined1 (*) [8])
         ((iStack_230._M_current)->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).
         m_storage.m_data.array = local_188;
        *(double *)
         (((iStack_230._M_current)->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).
          m_storage.m_data.array + 2) = uStack_180;
        iStack_230._M_current = iStack_230._M_current + 1;
      }
      pMVar14 = pMVar14 + 1;
    } while (pMVar14 != pMVar3);
  }
  paVar8 = (mesh->tvi).
           super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((mesh->tvi).super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>.
      _M_impl.super__Vector_impl_data._M_finish != paVar8) {
    paVar2 = (mesh->tti).
             super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    paVar4 = (mesh->tti).
             super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    fVar16 = (float)texturemap_resolution;
    lVar15 = 8;
    uVar10 = 0;
    local_1e8 = &mesh->tti;
    do {
      pvVar9 = local_1e8;
      if (paVar2 == paVar4) {
        pvVar9 = local_1e0;
      }
      uVar11 = (ulong)*(int *)((long)paVar8->_M_elems + lVar15 + -8);
      uVar12 = uVar11 + 0x3f;
      if (-1 < (long)uVar11) {
        uVar12 = uVar11;
      }
      if ((local_218.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p
           [((long)uVar12 >> 6) + ((ulong)((uVar11 & 0x800000000000003f) < 0x8000000000000001) - 1)]
           >> (uVar11 & 0x3f) & 1) != 0) {
        uVar11 = (ulong)*(int *)((long)paVar8->_M_elems + lVar15 + -4);
        uVar12 = uVar11 + 0x3f;
        if (-1 < (long)uVar11) {
          uVar12 = uVar11;
        }
        if ((local_218.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p
             [((long)uVar12 >> 6) +
              ((ulong)((uVar11 & 0x800000000000003f) < 0x8000000000000001) - 1)] >> (uVar11 & 0x3f)
            & 1) != 0) {
          uVar11 = (ulong)*(int *)((long)paVar8->_M_elems + lVar15);
          uVar12 = uVar11 + 0x3f;
          if (-1 < (long)uVar11) {
            uVar12 = uVar11;
          }
          if ((local_218.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
               ._M_start.super__Bit_iterator_base._M_p
               [((long)uVar12 >> 6) +
                ((ulong)((uVar11 & 0x800000000000003f) < 0x8000000000000001) - 1)] >>
               (uVar11 & 0x3f) & 1) != 0) {
            paVar5 = (pvVar9->
                     super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            iVar1 = *(int *)((long)paVar5->_M_elems + lVar15 + -8);
            pMVar6 = (mesh->texcoords).
                     super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_1d8.position.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
            m_storage.m_data.array[0] =
                 (double)(pMVar6[iVar1].super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.
                          m_storage.m_data.array[0] * fVar16);
            lVar13 = (long)*(int *)((long)paVar8->_M_elems + lVar15 + -8) * 0x10;
            local_1d8.position.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
            m_storage.m_data.array[2] = (double)*(float *)((long)local_238 + lVar13 + 8);
            local_1d8.position.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
            m_storage.m_data.array[3] = (double)*(float *)((long)local_238 + lVar13 + 0xc);
            local_1d8.position.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
            m_storage.m_data.array[1] =
                 (double)(*(float *)((long)&pMVar6[iVar1].
                                            super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>
                                            .m_storage.m_data + 4) * fVar16);
            fVar22 = (float)image->width_;
            fVar18 = *(float *)((long)local_238 + lVar13) / fVar22;
            fVar23 = (float)image->height_;
            fVar17 = *(float *)((long)local_238 + lVar13 + 4) / fVar23;
            local_1d8.texcoords.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.
            m_storage.m_data.array[0] = (double)fVar18;
            local_1d8.texcoords.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.
            m_storage.m_data.array[1] = (double)fVar17;
            iVar1 = *(int *)((long)paVar5->_M_elems + lVar15 + -4);
            lVar13 = (long)*(int *)((long)paVar8->_M_elems + lVar15 + -4) * 0x10;
            local_178 = (double)*(float *)((long)local_238 + lVar13 + 8);
            local_170 = (double)*(float *)((long)local_238 + lVar13 + 0xc);
            uStack_180 = (double)(*(float *)((long)&pMVar6[iVar1].
                                                                                                        
                                                  super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>
                                                  .m_storage.m_data + 4) * fVar16);
            local_188 = (undefined1  [8])
                        (double)(pMVar6[iVar1].
                                 super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.
                                 m_storage.m_data.array[0] * fVar16);
            fVar24 = *(float *)((long)local_238 + lVar13) / fVar22;
            fVar21 = *(float *)((long)local_238 + lVar13 + 4) / fVar23;
            local_148 = (double)fVar24;
            local_140 = (double)fVar21;
            iVar1 = *(int *)((long)paVar5->_M_elems + lVar15);
            local_88.position.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
            .m_data.array[0] =
                 (double)(pMVar6[iVar1].super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.
                          m_storage.m_data.array[0] * fVar16);
            local_88.position.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
            .m_data.array[1] =
                 (double)(*(float *)((long)&pMVar6[iVar1].
                                            super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>
                                            .m_storage.m_data + 4) * fVar16);
            lVar13 = (long)*(int *)((long)paVar8->_M_elems + lVar15) * 0x10;
            local_88.position.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
            .m_data.array[2] = (double)*(float *)((long)local_238 + lVar13 + 8);
            local_88.position.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
            .m_data.array[3] = (double)*(float *)((long)local_238 + lVar13 + 0xc);
            fVar22 = *(float *)((long)local_238 + lVar13) / fVar22;
            fVar23 = *(float *)((long)local_238 + lVar13 + 4) / fVar23;
            local_88.texcoords.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.
            m_storage.m_data.array[0] = (double)fVar22;
            local_88.texcoords.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.
            m_storage.m_data.array[1] = (double)fVar23;
            if (((((0.0 <= fVar18) && (fVar18 <= 1.0)) && (0.0 <= fVar17)) &&
                ((((fVar17 <= 1.0 && (0.0 <= fVar24)) &&
                  ((fVar24 <= 1.0 && ((0.0 <= fVar21 && (fVar21 <= 1.0)))))) && (0.0 <= fVar22))))
               && (((fVar22 <= 1.0 && (0.0 <= fVar23)) && (fVar23 <= 1.0)))) {
              std::
              vector<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>,_std::allocator<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>_>_>
              ::vector((vector<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>,_std::allocator<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>_>_>
                        *)&local_130,&local_108.mipmaps);
              local_130.super__Optional_base<eos::render::Texture,_false,_false>._M_payload.
              super__Optional_payload<eos::render::Texture,_true,_false,_false>.
              super__Optional_payload_base<eos::render::Texture>._M_payload._M_value.widthLog =
                   local_108.widthLog;
              local_130.super__Optional_base<eos::render::Texture,_false,_false>._M_payload.
              super__Optional_payload<eos::render::Texture,_true,_false,_false>.
              super__Optional_payload_base<eos::render::Texture>._M_payload._M_value.heightLog =
                   local_108.heightLog;
              local_130.super__Optional_base<eos::render::Texture,_false,_false>._M_payload.
              super__Optional_payload<eos::render::Texture,_true,_false,_false>.
              super__Optional_payload_base<eos::render::Texture>._M_payload._26_2_ =
                   local_108._26_2_;
              local_130.super__Optional_base<eos::render::Texture,_false,_false>._M_payload.
              super__Optional_payload<eos::render::Texture,_true,_false,_false>.
              super__Optional_payload_base<eos::render::Texture>._M_payload._M_value.mipmaps_num =
                   local_108.mipmaps_num;
              local_130.super__Optional_base<eos::render::Texture,_false,_false>._M_payload.
              super__Optional_payload<eos::render::Texture,_true,_false,_false>.
              super__Optional_payload_base<eos::render::Texture>._M_engaged = true;
              Rasterizer<eos::render::ExtractionFragmentShader>::raster_triangle<double>
                        (&local_e8,&local_1d8,(Vertex<double> *)local_188,&local_88,&local_130);
              if (local_130.super__Optional_base<eos::render::Texture,_false,_false>._M_payload.
                  super__Optional_payload<eos::render::Texture,_true,_false,_false>.
                  super__Optional_payload_base<eos::render::Texture>._M_engaged == true) {
                local_130.super__Optional_base<eos::render::Texture,_false,_false>._M_payload.
                super__Optional_payload<eos::render::Texture,_true,_false,_false>.
                super__Optional_payload_base<eos::render::Texture>._M_engaged = false;
                std::
                vector<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>,_std::allocator<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>_>_>
                ::~vector((vector<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>,_std::allocator<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>_>_>
                           *)&local_130);
              }
            }
          }
        }
      }
      uVar10 = uVar10 + 1;
      paVar8 = (mesh->tvi).
               super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      lVar15 = lVar15 + 0xc;
    } while (uVar10 < (ulong)(((long)(mesh->tvi).
                                     super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)paVar8 >> 2)
                             * -0x5555555555555555));
  }
  pIVar7 = local_1f0;
  local_1f0->row_stride = local_e8.colorbuffer.row_stride;
  local_1f0->height_ = local_e8.colorbuffer.height_;
  local_1f0->width_ = local_e8.colorbuffer.width_;
  this = &local_1f0->data_;
  (local_1f0->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_1f0->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_1f0->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::_M_create_storage
            (&this->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>,
             (long)local_e8.colorbuffer.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_e8.colorbuffer.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start);
  __dest = (this->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  __n = (long)local_e8.colorbuffer.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_e8.colorbuffer.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start;
  if (__n != 0) {
    memmove(__dest,local_e8.colorbuffer.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,__n);
  }
  (pIVar7->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = __dest + __n;
  if (local_238 != (void *)0x0) {
    operator_delete(local_238,(long)local_228 - (long)local_238);
  }
  if (local_218.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_218.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_218.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_218.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_218.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_218.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
    local_218.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_218.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_offset = 0;
    local_218.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  std::
  vector<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>,_std::allocator<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>_>_>
  ::~vector(&local_108.mipmaps);
  if (local_e8.depthbuffer.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.depthbuffer.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_e8.depthbuffer.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.depthbuffer.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_e8.colorbuffer.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.colorbuffer.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_e8.colorbuffer.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.colorbuffer.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return pIVar7;
}

Assistant:

inline eos::core::Image4u extract_texture(const core::Mesh& mesh, Eigen::Matrix4f view_model_matrix,
                                          Eigen::Matrix4f projection_matrix, ProjectionType projection_type,
                                          const eos::core::Image4u& image, int texturemap_resolution = 512)
{
    // Assert that either there are texture coordinates given for each vertex (in which case the texture map
    // doesn't contain any seams), or that a separate list of texture triangle indices is given (i.e. mesh.tti
    // is not empty):
    assert(mesh.vertices.size() == mesh.texcoords.size() || !mesh.tti.empty());
    // Sanity check on the texture triangle indices: They should be either empty or equal to tvi.size():
    assert(mesh.tti.empty() || mesh.tti.size() == mesh.tvi.size());

    using detail::divide_by_w;
    using detail::RayDirection;
    using Eigen::Vector2f;
    using Eigen::Vector2d;
    using Eigen::Vector3f;
    using Eigen::Vector3d;
    using Eigen::Vector4f;
    using Eigen::Vector4d;
    using std::vector;
    // We only need a rasteriser to remap the texture, not the complete SoftwareRenderer:
    Rasterizer<ExtractionFragmentShader> extraction_rasterizer(texturemap_resolution, texturemap_resolution);
    Texture image_to_extract_from_as_tex = create_mipmapped_texture(image, 1);
    extraction_rasterizer.enable_depth_test = false; // We don't need to depth-test in the rendered image (which is the texture map).
    extraction_rasterizer.perspective_correct_barycentric_weights = false; // We want the uncorrected lambda be passed to our shader

    // For the per-vertex view angle, and the self-occlusion tests, we have to know the projection type, and
    // then use different vector directions depending on the projection type:
    RayDirection ray_direction_type;
    if (projection_type == ProjectionType::Orthographic)
    {
        ray_direction_type = RayDirection::Parallel;
    } else
    {
        ray_direction_type = RayDirection::TowardsOrigin;
    }

    // Test for self-occlusion, i.e. whether each vertex is visible from
    // the camera origin:
    const vector<bool> per_vertex_visibility = compute_per_vertex_self_occlusion(
        mesh.vertices, mesh.tvi, view_model_matrix, ray_direction_type);

    vector<Vector4f> wnd_coords; // will contain [x_wnd, y_wnd, z_ndc, 1/w_clip]
    for (auto&& vtx : mesh.vertices)
    {
        Vector4f clip_coords = projection_matrix * view_model_matrix * vtx.homogeneous();
        clip_coords = divide_by_w(clip_coords);
        // Note: We could make use of a new `viewport` parameter here, to allow any viewport transformations.
        const Vector2f screen_coords =
            clip_to_screen_space(clip_coords.x(), clip_coords.y(), image.width(), image.height());
        clip_coords.x() = screen_coords.x(); // Todo: Can simplify this...?
        clip_coords.y() = screen_coords.y();
        wnd_coords.push_back(clip_coords);
    }

    // Go on with extracting: This only needs the rasteriser/FS, not the whole Renderer.
    const int tex_width = texturemap_resolution;
    const int tex_height =
        texturemap_resolution; // keeping this in case we need non-square texture maps at some point

    // Use Mesh::tti as texture triangle indices if present, tvi otherwise:
    const auto& mesh_tti = mesh.tti.empty() ? mesh.tvi : mesh.tti;

    for (std::size_t triangle_index = 0; triangle_index < mesh.tvi.size(); ++triangle_index)
    {
        // Select the three indices for the current triangle:
        const auto& tvi = mesh.tvi[triangle_index];
        const auto& tti = mesh_tti[triangle_index];

        // Check if all three vertices of the current triangle are visible, and use the triangle if so:
        if (per_vertex_visibility[tvi[0]] && per_vertex_visibility[tvi[1]] &&
            per_vertex_visibility[tvi[2]]) // can also try using ||, but...
        {
            // The model's texcoords become the locations to extract to in the framebuffer (which is the
            // texture map we're extracting to). The wnd_coords are the coordinates we're extracting from (the
            // original image), which from the perspective of the rasteriser, is the texture map, and thus
            // from the rasteriser's perspective they're the texture coords.
            //
            // (Note: A test with a rendered & re-extracted texture showed that we're off by a pixel or more,
            //  definitely need to correct this. Probably here. It looks like it is 1-2 pixels off. Definitely
            //  a bit more than 1.)
            detail::Vertex<double> pa{
                Vector4d(mesh.texcoords[tti[0]][0] * tex_width,
					 mesh.texcoords[tti[0]][1] * tex_height,
                     wnd_coords[tvi[0]].z(), // z_ndc
                     wnd_coords[tvi[0]].w()), // 1/w_clip
                Vector3d(),                       // empty
                Vector2d(wnd_coords[tvi[0]].x() / image.width(),
                     wnd_coords[tvi[0]].y() /
                         image.height() // (maybe '1 - wndcoords...'?) wndcoords of the projected/rendered
                                        // model triangle (in the input img). Normalised to 0,1.
					)};
            detail::Vertex<double> pb{
                Vector4d(mesh.texcoords[tti[1]][0] * tex_width,
				mesh.texcoords[tti[1]][1] * tex_height,
                     wnd_coords[tvi[1]].z(), // z_ndc
                     wnd_coords[tvi[1]].w()), // 1/w_clip
                Vector3d(),                       // empty
                Vector2d(wnd_coords[tvi[1]].x() / image.width(),
                     wnd_coords[tvi[1]].y() /
                         image.height() // (maybe '1 - wndcoords...'?) wndcoords of the projected/rendered
                                        // model triangle (in the input img). Normalised to 0,1.
					)};
            detail::Vertex<double> pc{
                Vector4d(mesh.texcoords[tti[2]][0] * tex_width,
				mesh.texcoords[tti[2]][1] * tex_height,
                     wnd_coords[tvi[2]].z(), // z_ndc
				wnd_coords[tvi[2]].w()), // 1/w_clip
                Vector3d(),                       // empty
                Vector2d(wnd_coords[tvi[2]].x() / image.width(),
                     wnd_coords[tvi[2]].y() /
                         image.height() // (maybe '1 - wndcoords...'?) wndcoords of the projected/rendered
                                        // model triangle (in the input img). Normalised to 0,1.
					)};
            // The wnd_coords (now p[a|b|c].texcoords) can actually be outside the image, if the head is
            // outside the image. Just skip the whole triangle if that is the case:
            if (pa.texcoords.x() < 0 || pa.texcoords.x() > 1 || pa.texcoords.y() < 0 || pa.texcoords.y() > 1 ||
                pb.texcoords.x() < 0 || pb.texcoords.x() > 1 || pb.texcoords.y() < 0 || pb.texcoords.y() > 1 ||
                pc.texcoords.x() < 0 || pc.texcoords.x() > 1 || pc.texcoords.y() < 0 || pc.texcoords.y() > 1)
            {
                continue;
            }
            extraction_rasterizer.raster_triangle(pa, pb, pc, image_to_extract_from_as_tex);
        }
    }

    return extraction_rasterizer.colorbuffer;
}